

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O3

void __thiscall bandit::reporter::spec::it_unknown_error(spec *this,string *desc)

{
  ostream *poVar1;
  char cVar2;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  progress_base::it_unknown_error((progress_base *)this,desc);
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(&local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((this->super_colored_base).stm_,"ERROR",5);
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(&local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  poVar1 = (this->super_colored_base).stm_;
  cVar2 = (char)poVar1;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void it_unknown_error(const std::string& desc) override {
        progress_base::it_unknown_error(desc);
        stm_ << colorizer_.bad();
        stm_ << "ERROR";
        stm_ << colorizer_.reset();
        stm_ << std::endl;
        stm_.flush();
      }